

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::GPUShaderFP64Test8::iterate(GPUShaderFP64Test8 *this)

{
  bool bVar1;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  reference __x;
  undefined1 local_1a8 [8];
  _test_case test_case;
  __normal_iterator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_*,_std::vector<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>_>
  local_c0;
  __normal_iterator<const_std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_*,_std::vector<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>_>
  local_b8;
  _argument_lists_const_iterator argument_list_iterator;
  _argument_lists argument_lists;
  uint local_90;
  _variable_type variable_type;
  uint n_variable_type;
  uint n_variable_types;
  _variable_type variable_types [13];
  allocator<char> local_31;
  string local_30;
  GPUShaderFP64Test8 *local_10;
  GPUShaderFP64Test8 *this_local;
  
  local_10 = this;
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_gpu_shader_fp64");
  if (!bVar1) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"GL_ARB_gpu_shader_fp64 is not supported.",&local_31);
    tcu::NotSupportedError::NotSupportedError(this_01,&local_30);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  initTest(this);
  memcpy(&n_variable_type,&DAT_029fd510,0x34);
  for (local_90 = 0; local_90 < 0xd; local_90 = local_90 + 1) {
    argument_lists.
    super__Vector_base<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (&n_variable_type)[local_90];
    getArgumentListsForVariableType
              ((_argument_lists *)&argument_list_iterator,this,
               (_variable_type *)
               ((long)&argument_lists.
                       super__Vector_base<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    local_c0._M_current =
         (vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_> *)
         std::
         vector<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>
         ::begin((vector<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>
                  *)&argument_list_iterator);
    __gnu_cxx::
    __normal_iterator<std::vector<gl4cts::Utils::_variable_type,std::allocator<gl4cts::Utils::_variable_type>>const*,std::vector<std::vector<gl4cts::Utils::_variable_type,std::allocator<gl4cts::Utils::_variable_type>>,std::allocator<std::vector<gl4cts::Utils::_variable_type,std::allocator<gl4cts::Utils::_variable_type>>>>>
    ::
    __normal_iterator<std::vector<gl4cts::Utils::_variable_type,std::allocator<gl4cts::Utils::_variable_type>>*>
              ((__normal_iterator<std::vector<gl4cts::Utils::_variable_type,std::allocator<gl4cts::Utils::_variable_type>>const*,std::vector<std::vector<gl4cts::Utils::_variable_type,std::allocator<gl4cts::Utils::_variable_type>>,std::allocator<std::vector<gl4cts::Utils::_variable_type,std::allocator<gl4cts::Utils::_variable_type>>>>>
                *)&local_b8,&local_c0);
    while( true ) {
      test_case.vs_shader_body.field_2._8_8_ =
           std::
           vector<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>
           ::end((vector<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>
                  *)&argument_list_iterator);
      bVar1 = __gnu_cxx::operator!=
                        (&local_b8,
                         (__normal_iterator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_*,_std::vector<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>_>
                          *)((long)&test_case.vs_shader_body.field_2 + 8));
      if (!bVar1) break;
      _test_case::_test_case((_test_case *)local_1a8);
      __x = __gnu_cxx::
            __normal_iterator<const_std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_*,_std::vector<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>_>
            ::operator*(&local_b8);
      std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>::
      operator=((vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
                 *)local_1a8,__x);
      test_case.argument_list.
      super__Vector_base<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           argument_lists.
           super__Vector_base<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      initIteration(this,(_test_case *)local_1a8);
      bVar1 = executeIteration(this,(_test_case *)local_1a8);
      this->m_has_test_passed = (this->m_has_test_passed & 1U & bVar1) != 0;
      _test_case::~_test_case((_test_case *)local_1a8);
      __gnu_cxx::
      __normal_iterator<const_std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_*,_std::vector<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>_>
      ::operator++(&local_b8,0);
    }
    std::
    vector<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>
    ::~vector((vector<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>
               *)&argument_list_iterator);
  }
  if ((this->m_has_test_passed & 1U) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GPUShaderFP64Test8::iterate()
{
	/* Do not execute the test if GL_ARB_texture_view is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader_fp64"))
	{
		throw tcu::NotSupportedError("GL_ARB_gpu_shader_fp64 is not supported.");
	}

	/* Initialize GL objects needed to run the tests */
	initTest();

	/* Build iteration array to run the tests in an automated manner */
	const Utils::_variable_type variable_types[] = { Utils::VARIABLE_TYPE_DMAT2,   Utils::VARIABLE_TYPE_DMAT2X3,
													 Utils::VARIABLE_TYPE_DMAT2X4, Utils::VARIABLE_TYPE_DMAT3,
													 Utils::VARIABLE_TYPE_DMAT3X2, Utils::VARIABLE_TYPE_DMAT3X4,
													 Utils::VARIABLE_TYPE_DMAT4,   Utils::VARIABLE_TYPE_DMAT4X2,
													 Utils::VARIABLE_TYPE_DMAT4X3, Utils::VARIABLE_TYPE_DOUBLE,
													 Utils::VARIABLE_TYPE_DVEC2,   Utils::VARIABLE_TYPE_DVEC3,
													 Utils::VARIABLE_TYPE_DVEC4 };
	const unsigned int n_variable_types = sizeof(variable_types) / sizeof(variable_types[0]);

	for (unsigned int n_variable_type = 0; n_variable_type < n_variable_types; ++n_variable_type)
	{
		const Utils::_variable_type variable_type = variable_types[n_variable_type];

		/* Construct a set of argument lists valid for the variable type considered */
		_argument_lists argument_lists = getArgumentListsForVariableType(variable_type);

		for (_argument_lists_const_iterator argument_list_iterator = argument_lists.begin();
			 argument_list_iterator != argument_lists.end(); argument_list_iterator++)
		{
			/* Constructor thwe test case descriptor */
			_test_case test_case;

			test_case.argument_list = *argument_list_iterator;
			test_case.type			= variable_type;

			/* Initialize a program object we will use to perform the casting */
			initIteration(test_case);

			/* See if the shader compiles. */
			m_has_test_passed &= executeIteration(test_case);
		} /* for (all argument lists) */
	}	 /* for (all variable types) */

	/* We're done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}